

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  char *__last;
  bool bVar1;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char acStack_28 [32];
  
  uVar5 = *(ulong *)this;
  __last = acStack_28 + *(int *)(this + 8);
  pcVar3 = __last;
  uVar7 = uVar5;
  if (99 < uVar5) {
    do {
      uVar5 = uVar7 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar7 + (int)uVar5 * -100) * 2)
      ;
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar7;
      uVar7 = uVar5;
    } while (bVar1);
  }
  bVar2 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar6 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
    lVar6 = -2;
  }
  pcVar3[lVar6] = bVar4;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (acStack_28,__last,bVar2);
  it->container = (list<char,_std::allocator<char>_> *)bVar2;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }